

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::rehash
          (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this,size_t sizeHint)

{
  QPersistentModelIndex *key;
  ulong uVar1;
  Span *pSVar2;
  QPersistentModelIndexData *pQVar3;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar4;
  ulong uVar5;
  ulong uVar6;
  Span *pSVar7;
  size_t index;
  size_t numBuckets;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  R RVar10;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar8 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar8 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar10 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar10.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar1) {
    uVar5 = 0;
    pSVar7 = pSVar2;
    do {
      lVar8 = 0;
      do {
        if ((ulong)pSVar7->offsets[lVar8] != 0xff) {
          key = (QPersistentModelIndex *)(pSVar2[uVar5].entries + pSVar7->offsets[lVar8]);
          local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
          local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
          uVar6 = ((ulong)key->d >> 0x20 ^ (ulong)key->d) * -0x2917014799a6026d;
          uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
          local_48 = findBucketWithHash<QPersistentModelIndex>
                               (this,key,uVar6 >> 0x20 ^ this->seed ^ uVar6);
          pNVar4 = Bucket::insert(&local_48);
          pQVar3 = key->d;
          key->d = (QPersistentModelIndexData *)0x0;
          (pNVar4->key).d = pQVar3;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x80);
      Span<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::freeData(pSVar2 + uVar5);
      uVar5 = uVar5 + 1;
      pSVar7 = pSVar7 + 1;
    } while (uVar5 != uVar1 >> 7);
  }
  if (pSVar2 != (Span *)0x0) {
    lVar8 = *(long *)&pSVar2[-1].allocated;
    if (lVar8 != 0) {
      lVar9 = lVar8 * 0x90;
      do {
        Span<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::freeData
                  ((Span<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                   (pSVar2[-1].offsets + lVar9));
        lVar9 = lVar9 + -0x90;
      } while (lVar9 != 0);
    }
    operator_delete__(&pSVar2[-1].allocated,lVar8 * 0x90 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }